

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O0

bool google::protobuf::compiler::java::HasRequiredFields
               (Descriptor *type,
               hash_set<const_google::protobuf::Descriptor_*,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>_>
               *already_seen)

{
  bool bVar1;
  int iVar2;
  JavaType JVar3;
  size_type sVar4;
  FieldDescriptor *this;
  Descriptor *type_00;
  FieldDescriptor *field;
  int i;
  hash_set<const_google::protobuf::Descriptor_*,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>_>
  *already_seen_local;
  Descriptor *type_local;
  
  already_seen_local =
       (hash_set<const_google::protobuf::Descriptor_*,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>_>
        *)type;
  sVar4 = std::
          unordered_set<const_google::protobuf::Descriptor_*,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
          ::count(&already_seen->
                   super_unordered_set<const_google::protobuf::Descriptor_*,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                  ,(key_type *)&already_seen_local);
  if (sVar4 == 0) {
    std::
    unordered_set<const_google::protobuf::Descriptor_*,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
    ::insert(&already_seen->
              super_unordered_set<const_google::protobuf::Descriptor_*,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
             ,(value_type *)&already_seen_local);
    iVar2 = Descriptor::extension_range_count((Descriptor *)already_seen_local);
    if (iVar2 < 1) {
      for (field._4_4_ = 0; iVar2 = Descriptor::field_count((Descriptor *)already_seen_local),
          field._4_4_ < iVar2; field._4_4_ = field._4_4_ + 1) {
        this = Descriptor::field((Descriptor *)already_seen_local,field._4_4_);
        bVar1 = FieldDescriptor::is_required(this);
        if (bVar1) {
          return true;
        }
        JVar3 = GetJavaType(this);
        if (JVar3 == JAVATYPE_MESSAGE) {
          type_00 = FieldDescriptor::message_type(this);
          bVar1 = HasRequiredFields(type_00,already_seen);
          if (bVar1) {
            return true;
          }
        }
      }
      type_local._7_1_ = false;
    }
    else {
      type_local._7_1_ = true;
    }
  }
  else {
    type_local._7_1_ = false;
  }
  return type_local._7_1_;
}

Assistant:

bool HasRequiredFields(
    const Descriptor* type,
    hash_set<const Descriptor*>* already_seen) {
  if (already_seen->count(type) > 0) {
    // The type is already in cache.  This means that either:
    // a. The type has no required fields.
    // b. We are in the midst of checking if the type has required fields,
    //    somewhere up the stack.  In this case, we know that if the type
    //    has any required fields, they'll be found when we return to it,
    //    and the whole call to HasRequiredFields() will return true.
    //    Therefore, we don't have to check if this type has required fields
    //    here.
    return false;
  }
  already_seen->insert(type);

  // If the type has extensions, an extension with message type could contain
  // required fields, so we have to be conservative and assume such an
  // extension exists.
  if (type->extension_range_count() > 0) return true;

  for (int i = 0; i < type->field_count(); i++) {
    const FieldDescriptor* field = type->field(i);
    if (field->is_required()) {
      return true;
    }
    if (GetJavaType(field) == JAVATYPE_MESSAGE) {
      if (HasRequiredFields(field->message_type(), already_seen)) {
        return true;
      }
    }
  }

  return false;
}